

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

boolean destroy_item(int osym,int dmgtyp)

{
  obj *poVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  char *local_a8;
  boolean one;
  char *how;
  boolean cloak_protect;
  char *pcStack_60;
  boolean seen_destroy;
  char *mult;
  long lStack_50;
  int dindx;
  long quan;
  long cnt;
  long i;
  int skip;
  int xresist;
  int dmg;
  obj *obj2;
  obj *obj;
  int dmgtyp_local;
  int osym_local;
  
  how._7_1_ = '\0';
  if (((((dmgtyp == 3) &&
        (((u.uprops[2].intrinsic != 0 || (u.uprops[2].extrinsic != 0)) ||
         ((youmonst.mintrinsics & 2) != 0)))) &&
       (((((u.uprops[2].intrinsic & 0x4000000) == 0 || ((u.uprops[2].intrinsic & 0xfbffffff) != 0))
         || (u.uprops[2].extrinsic != 0)) || ((youmonst.mintrinsics & 2) != 0)))) ||
      ((dmgtyp == 2 &&
       ((((u.uprops[1].intrinsic != 0 || (u.uprops[1].extrinsic != 0)) ||
         ((youmonst.mintrinsics & 1) != 0)) &&
        (((((u.uprops[1].intrinsic & 0x4000000) == 0 || ((u.uprops[1].intrinsic & 0xfbffffff) != 0))
          || (u.uprops[1].extrinsic != 0)) || ((youmonst.mintrinsics & 1) != 0)))))))) ||
     (((dmgtyp == 6 &&
       (((u.uprops[5].intrinsic != 0 || (u.uprops[5].extrinsic != 0)) ||
        ((youmonst.mintrinsics & 0x10) != 0)))) &&
      ((((u.uprops[5].intrinsic & 0x4000000) == 0 || ((u.uprops[5].intrinsic & 0xfbffffff) != 0)) ||
       ((u.uprops[5].extrinsic != 0 || ((youmonst.mintrinsics & 0x10) != 0)))))))) {
    dmgtyp_local._3_1_ = '\0';
  }
  else {
    bVar5 = false;
    if (uarmc != (obj *)0x0) {
      bVar5 = uarmc->otyp == 0x84;
    }
    obj2 = invent;
    poVar1 = obj2;
    while (obj2 = poVar1, obj2 != (obj *)0x0) {
      poVar1 = obj2->nobj;
      if (((obj2->oclass == osym) && (obj2->oartifact == '\0')) &&
         ((((*(uint *)&obj2->field_0x4a >> 0x17 & 1) == 0 || (obj2->quan != 1)) &&
          ((!bVar5 || (iVar2 = rn2(5), iVar2 == 0)))))) {
        i._4_4_ = 0;
        bVar6 = false;
        mult._4_4_ = 0;
        skip = 0;
        lStack_50 = 0;
        if (dmgtyp == 2) {
          if ((((u.uprops[1].intrinsic != 0) || (u.uprops[1].extrinsic != 0)) ||
              (bVar6 = false, (youmonst.mintrinsics & 1) != 0)) &&
             ((((u.uprops[1].intrinsic & 0x4000000) == 0 ||
               ((u.uprops[1].intrinsic & 0xfbffffff) != 0)) ||
              ((u.uprops[1].extrinsic != 0 || (bVar6 = false, (youmonst.mintrinsics & 1) != 0))))))
          {
            bVar6 = obj2->oclass != '\b';
          }
          if ((obj2->otyp == 0x162) || (obj2->otyp == 0x17f)) {
            i._4_4_ = 1;
          }
          if ((obj2->otyp == 0x1bd) &&
             (((i._4_4_ = i._4_4_ + 1, u.uprops[0x1e].intrinsic == 0 &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
            pcVar4 = xname(obj2);
            pcVar4 = The(pcVar4);
            pcVar3 = hcolor("dark red");
            pline("%s glows a strange %s, but remains intact.",pcVar4,pcVar3);
          }
          lStack_50 = (long)obj2->quan;
          if (osym == 8) {
            mult._4_4_ = 1;
            skip = rnd(6);
          }
          else if (osym == 9) {
            mult._4_4_ = 2;
            skip = 1;
          }
          else if (osym == 10) {
            mult._4_4_ = 3;
            skip = 1;
          }
          else {
            i._4_4_ = i._4_4_ + 1;
          }
          if (((i._4_4_ == 0) && ((u.uprops[1].intrinsic & 0x4000000) != 0)) &&
             (((u.uprops[1].intrinsic & 0xfbffffff) == 0 &&
              (((u.uprops[1].extrinsic == 0 && ((youmonst.mintrinsics & 1) == 0)) &&
               (obj2->oclass != '\b')))))) {
            skip = (skip + 1) / 2;
          }
        }
        else if (dmgtyp == 3) {
          if ((osym == 8) && (obj2->otyp != 0x142)) {
            lStack_50 = (long)obj2->quan;
            skip = rnd(4);
          }
          else {
            i._4_4_ = 1;
          }
          mult._4_4_ = 0;
        }
        else if (dmgtyp == 6) {
          if (((u.uprops[5].intrinsic != 0) || (u.uprops[5].extrinsic != 0)) ||
             (bVar6 = false, (youmonst.mintrinsics & 0x10) != 0)) {
            bVar6 = false;
            if ((((u.uprops[5].intrinsic & 0x4000000) != 0) &&
                (bVar6 = false, (u.uprops[5].intrinsic & 0xfbffffff) == 0)) &&
               (bVar6 = false, u.uprops[5].extrinsic == 0)) {
              bVar6 = (youmonst.mintrinsics & 0x10) == 0;
            }
            bVar6 = (bool)(bVar6 ^ 1);
          }
          lStack_50 = (long)obj2->quan;
          if (osym == 0xb) {
            if (obj2->otyp == 0x1d5) {
              i._4_4_ = 1;
            }
            else {
              mult._4_4_ = 4;
              skip = rnd(10);
            }
          }
          else {
            i._4_4_ = 1;
          }
          if (((i._4_4_ == 0) && ((u.uprops[5].intrinsic & 0x4000000) != 0)) &&
             (((u.uprops[5].intrinsic & 0xfbffffff) == 0 &&
              ((u.uprops[5].extrinsic == 0 && ((youmonst.mintrinsics & 0x10) == 0)))))) {
            skip = (skip + 1) / 2;
          }
        }
        else {
          i._4_4_ = 1;
        }
        if (i._4_4_ == 0) {
          if ((*(uint *)&obj2->field_0x4a >> 0x17 & 1) != 0) {
            lStack_50 = lStack_50 + -1;
          }
          quan = 0;
          for (cnt = 0; cnt < lStack_50; cnt = cnt + 1) {
            iVar2 = 3;
            if (bVar5) {
              iVar2 = 0xf;
            }
            iVar2 = rn2(iVar2);
            if (iVar2 == 0) {
              quan = quan + 1;
            }
          }
          if (quan != 0) {
            how._7_1_ = '\x01';
            if (quan == lStack_50) {
              pcStack_60 = "Your";
            }
            else {
              pcStack_60 = "Some of your";
              if (quan == 1) {
                pcStack_60 = "One of your";
              }
            }
            pcVar4 = xname(obj2);
            if (quan < 2) {
              local_a8 = destroy_strings[mult._4_4_ * 3];
            }
            else {
              local_a8 = destroy_strings[mult._4_4_ * 3 + 1];
            }
            pline("%s %s %s!",pcStack_60,pcVar4,local_a8);
            if (((osym == 8) && (dmgtyp != 3)) &&
               ((((youmonst.data)->mflags1 & 0x400) == 0 ||
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
              potionbreathe(obj2);
            }
            if (obj2->owornmask != 0) {
              if ((obj2->owornmask & 0x60000U) == 0) {
                setnotworn(obj2);
              }
              else {
                Ring_gone(obj2);
              }
            }
            if (obj2 == current_wand) {
              current_wand = (obj *)0x0;
            }
            for (cnt = 0; cnt < quan; cnt = cnt + 1) {
              useup(obj2);
            }
            if (skip != 0) {
              if (bVar6) {
                pline("You aren\'t hurt!");
              }
              else {
                pcVar4 = destroy_strings[mult._4_4_ * 3 + 2];
                if (quan != 1) {
                  pcVar4 = makeplural(pcVar4);
                }
                losehp(skip,pcVar4,(uint)(quan != 1));
                exercise(0,'\0');
              }
            }
          }
        }
      }
    }
    dmgtyp_local._3_1_ = how._7_1_;
  }
  return dmgtyp_local._3_1_;
}

Assistant:

boolean destroy_item(int osym, int dmgtyp)
{
	struct obj *obj, *obj2;
	int dmg, xresist, skip;
	long i, cnt, quan;
	int dindx;
	const char *mult;
	boolean seen_destroy = FALSE;
	boolean cloak_protect;

	/* elemental immunities prevent item destruction */
	if ((dmgtyp == AD_COLD && FCold_resistance) ||
	    (dmgtyp == AD_FIRE && FFire_resistance) ||
	    (dmgtyp == AD_ELEC && FShock_resistance))
	    return FALSE;

	/* cloak of protection prevents 80% of item destruction */
	cloak_protect = (uarmc && uarmc->otyp == CLOAK_OF_PROTECTION);

	for (obj = invent; obj; obj = obj2) {
	    obj2 = obj->nobj;
	    if (obj->oclass != osym) continue; /* test only objs of type osym */
	    if (obj->oartifact) continue; /* don't destroy artifacts */
	    if (obj->in_use && obj->quan == 1) continue; /* not available */
	    if (cloak_protect && rn2(5)) continue;
	    xresist = skip = 0;
	    dmg = dindx = 0;
	    quan = 0L;

	    switch(dmgtyp) {
		case AD_COLD:
		    if (osym == POTION_CLASS && obj->otyp != POT_OIL) {
			quan = obj->quan;
			dindx = 0;
			dmg = rnd(4);
		    } else skip++;
		    break;
		case AD_FIRE:
		    xresist = (FFire_resistance && obj->oclass != POTION_CLASS);

		    if (obj->otyp == SCR_FIRE || obj->otyp == SPE_FIREBALL)
			skip++;
		    if (obj->otyp == SPE_BOOK_OF_THE_DEAD) {
			skip++;
			if (!Blind)
			    pline("%s glows a strange %s, but remains intact.",
				The(xname(obj)), hcolor("dark red"));
		    }
		    quan = obj->quan;
		    switch(osym) {
			case POTION_CLASS:
			    dindx = 1;
			    dmg = rnd(6);
			    break;
			case SCROLL_CLASS:
			    dindx = 2;
			    dmg = 1;
			    break;
			case SPBOOK_CLASS:
			    dindx = 3;
			    dmg = 1;
			    break;
			default:
			    skip++;
			    break;
		    }
		    /* Partial fire resistance only helps if full fire immunity
		     * would have helped otherwise. */
		    if (!skip && PFire_resistance && obj->oclass != POTION_CLASS)
			dmg = (dmg + 1) / 2;
		    break;
		case AD_ELEC:
		    xresist = FShock_resistance;
		    quan = obj->quan;
		    switch(osym) {
			case WAND_CLASS:
			    if (obj->otyp == WAN_LIGHTNING) { skip++; break; }
			    dindx = 4;
			    dmg = rnd(10);
			    break;
			default:
			    skip++;
			    break;
		    }
		    /* Partial shock resistance only helps if full shock resistance
		     * would have helped otherwise. */
		    if (!skip && PShock_resistance)
			dmg = (dmg + 1) / 2;
		    break;
		default:
		    skip++;
		    break;
	    }
	    if (!skip) {
		if (obj->in_use) --quan; /* one will be used up elsewhere */
		for (i = cnt = 0L; i < quan; i++)
		    if (!rn2(cloak_protect ? 15 : 3)) cnt++;

		if (!cnt) continue;
		seen_destroy = TRUE;
		if (cnt == quan)	mult = "Your";
		else	mult = (cnt == 1L) ? "One of your" : "Some of your";
		pline("%s %s %s!", mult, xname(obj),
			(cnt > 1L) ? destroy_strings[dindx*3 + 1]
				  : destroy_strings[dindx*3]);
		if (osym == POTION_CLASS && dmgtyp != AD_COLD) {
		    if (!breathless(youmonst.data) || haseyes(youmonst.data))
		    	potionbreathe(obj);
		}
		if (obj->owornmask) {
		    if (obj->owornmask & W_RING) /* ring being worn */
			Ring_gone(obj);
		    else
			setnotworn(obj);
		}
		if (obj == current_wand) current_wand = 0;	/* destroyed */
		for (i = 0; i < cnt; i++)
		    useup(obj);
		if (dmg) {
		    if (xresist)	pline("You aren't hurt!");
		    else {
			const char *how = destroy_strings[dindx * 3 + 2];
			boolean one = (cnt == 1L);

			losehp(dmg, one ? how : (const char *)makeplural(how),
			       one ? KILLED_BY_AN : KILLED_BY);
			exercise(A_STR, FALSE);
		    }
		}
	    }
	}

	return seen_destroy;
}